

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O0

int parg_reorder(int argc,char **argv,char *optstring,parg_option *longopts)

{
  int iVar1;
  int iVar2;
  int local_48;
  int c;
  int optend;
  int lastind;
  parg_state ps;
  parg_option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  ps.nextchar = (char *)longopts;
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x142,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x143,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  argv_local._4_4_ = argc;
  if (1 < argc) {
    parg_init((parg_state *)&optend);
    do {
      c = (int)ps.optarg;
      iVar1 = parg_getopt_long((parg_state *)&optend,argc,argv,optstring,(parg_option *)ps.nextchar,
                               (int *)0x0);
      if (((iVar1 == 0x3f) || (iVar1 == 0x3a)) &&
         (iVar2 = is_argv_end((parg_state *)&optend,argc,argv), iVar2 != 0)) {
        c = (int)ps.optarg + -1;
        break;
      }
    } while (iVar1 != -1);
    local_48 = parg_reorder_simple(c,argv,optstring,(parg_option *)ps.nextchar);
    if (c < argc) {
      reverse(argv,local_48,c);
      reverse(argv,local_48,c + 1);
      local_48 = local_48 + 1;
    }
    argv_local._4_4_ = local_48;
  }
  return argv_local._4_4_;
}

Assistant:

int
parg_reorder(int argc, char *argv[],
             const char *optstring,
             const struct parg_option *longopts)
{
	struct parg_state ps;
	int lastind;
	int optend;
	int c;

	assert(argv != NULL);
	assert(optstring != NULL);

	if (argc < 2) {
		return argc;
	}

	parg_init(&ps);

	/* Find end of normal arguments */
	do {
		lastind = ps.optind;

		c = parg_getopt_long(&ps, argc, argv, optstring, longopts, NULL);

		/* Check for trailing option with error */
		if ((c == '?' || c == ':') && is_argv_end(&ps, argc, argv)) {
			lastind = ps.optind - 1;
			break;
		}
	} while (c != -1);

	optend = parg_reorder_simple(lastind, argv, optstring, longopts);

	/* Rotate `--` or trailing option with error into position */
	if (lastind < argc) {
		reverse(argv, optend, lastind);
		reverse(argv, optend, lastind + 1);
		++optend;
	}

	return optend;
}